

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::getCols(Highs *this,HighsInt *mask,HighsInt *num_col,double *costs,double *lower,
              double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,double *value)

{
  HighsIndexCollection index_collection;
  
  index_collection.dimension_ = -1;
  index_collection.is_interval_ = false;
  index_collection.from_ = -1;
  index_collection.to_ = -2;
  index_collection.is_set_ = false;
  index_collection.set_num_entries_ = -1;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  index_collection._41_8_ = 0;
  create(&index_collection,mask,(this->model_).lp_.num_col_);
  getColsInterface(this,&index_collection,num_col,costs,lower,upper,num_nz,start,index,value);
  if (index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return kOk;
}

Assistant:

HighsStatus Highs::getCols(const HighsInt* mask, HighsInt& num_col,
                           double* costs, double* lower, double* upper,
                           HighsInt& num_nz, HighsInt* start, HighsInt* index,
                           double* value) const {
  HighsIndexCollection index_collection;
  const bool create_error = create(index_collection, mask, model_.lp_.num_col_);
  assert(!create_error);
  (void)create_error;
  getColsInterface(index_collection, num_col, costs, lower, upper, num_nz,
                   start, index, value);
  return HighsStatus::kOk;
}